

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::ColladaLoader::CanRead(ColladaLoader *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  ZipArchiveIOSystem *zip_archive_00;
  byte unaff_R15B;
  string extension;
  ZipArchiveIOSystem zip_archive;
  string local_48;
  
  BaseImporter::GetExtension(&extension,pFile);
  if (pIOHandler == (IOSystem *)0x0 || !checkSig) {
    bVar1 = std::operator==(&extension,"dae");
    unaff_R15B = 1;
    if ((bVar1) || (bVar1 = std::operator==(&extension,"zae"), bVar1)) goto LAB_003edbea;
  }
  else {
    ZipArchiveIOSystem::ZipArchiveIOSystem(&zip_archive,pIOHandler,pFile,"r");
    bVar1 = ZipArchiveIOSystem::isOpen(&zip_archive);
    if (bVar1) {
      ColladaParser::ReadZaeManifest_abi_cxx11_
                (&local_48,(ColladaParser *)&zip_archive,zip_archive_00);
      unaff_R15B = local_48._M_string_length != 0;
      std::__cxx11::string::~string((string *)&local_48);
    }
    ZipArchiveIOSystem::~ZipArchiveIOSystem(&zip_archive);
    if (bVar1) goto LAB_003edbea;
  }
  bVar1 = std::operator==(&extension,"xml");
  if (bVar1) {
    if (pIOHandler == (IOSystem *)0x0) {
      unaff_R15B = 1;
      goto LAB_003edbea;
    }
  }
  else {
    unaff_R15B = extension._M_string_length == 0 || checkSig;
    if (pIOHandler == (IOSystem *)0x0 || extension._M_string_length != 0 && !checkSig)
    goto LAB_003edbea;
  }
  unaff_R15B = BaseImporter::SearchFileHeaderForToken
                         (pIOHandler,pFile,CanRead::tokens,1,200,false,false);
LAB_003edbea:
  std::__cxx11::string::~string((string *)&extension);
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool ColladaLoader::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    bool readSig = checkSig && (pIOHandler != nullptr);

    if (!readSig) {
        if (extension == "dae" || extension == "zae") {
            return true;
        }
    }

    if (readSig) {
        // Look for a DAE file inside, but don't extract it
        ZipArchiveIOSystem zip_archive(pIOHandler, pFile);
        if (zip_archive.isOpen())
            return !ColladaParser::ReadZaeManifest(zip_archive).empty();
    }

    // XML - too generic, we need to open the file and search for typical keywords
    if (extension == "xml" || !extension.length() || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be NULL and it's our duty to return true here.
         */
        if (!pIOHandler) {
            return true;
        }
        static const char* tokens[] = { "<collada" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }

    return false;
}